

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O2

void __thiscall
SSD1306::OledBitmap<16,_16>::OledBitmap(OledBitmap<16,_16> *this,initializer_list<int> list)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  
  (this->super_OledPixel)._vptr_OledPixel = (_func_int **)&PTR__OledPixel_00108b40;
  (this->blocks_)._M_elems[0] = (_Type)0x0;
  (this->blocks_)._M_elems[1] = (_Type)0x0;
  (this->blocks_)._M_elems[2] = (_Type)0x0;
  (this->blocks_)._M_elems[3] = (_Type)0x0;
  (this->blocks_)._M_elems[4] = (_Type)0x0;
  (this->blocks_)._M_elems[5] = (_Type)0x0;
  (this->blocks_)._M_elems[6] = (_Type)0x0;
  (this->blocks_)._M_elems[7] = (_Type)0x0;
  (this->blocks_)._M_elems[8] = (_Type)0x0;
  (this->blocks_)._M_elems[9] = (_Type)0x0;
  (this->blocks_)._M_elems[10] = (_Type)0x0;
  (this->blocks_)._M_elems[0xb] = (_Type)0x0;
  (this->blocks_)._M_elems[0xc] = (_Type)0x0;
  (this->blocks_)._M_elems[0xd] = (_Type)0x0;
  (this->blocks_)._M_elems[0xe] = (_Type)0x0;
  (this->blocks_)._M_elems[0xf] = (_Type)0x0;
  uVar4 = 0;
  iVar5 = 0;
  for (lVar3 = 0; list._M_len * 4 != lVar3; lVar3 = lVar3 + 4) {
    (this->blocks_)._M_elems[uVar4]._M_elems[iVar5] = *(uchar *)((long)list._M_array + lVar3);
    bVar1 = 0 < iVar5;
    bVar2 = 0 < iVar5;
    iVar5 = iVar5 + 1;
    if (bVar2) {
      iVar5 = 0;
    }
    uVar4 = uVar4 + bVar1;
  }
  return;
}

Assistant:

OledBitmap(std::initializer_list<int> list)
    :
        blocks_{}
    {
        auto byte = 0;
        auto block = 0;

        for (auto item : list)
        {
            blocks_[block][byte++] = item;

            if ((byte * 8) >= Width)
            {
                byte = 0;
                block += 1;
            }
        }
    }